

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_int>::test_one<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint numer,uint denom,
          divider<unsigned_int,_(libdivide::Branching)1> *the_divider)

{
  int iVar1;
  uint uVar2;
  uint *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint result;
  uint expect;
  uint32_t t;
  uint32_t q;
  uint64_t rl;
  uint64_t yl;
  uint64_t xl;
  string local_a0 [4];
  int in_stack_ffffffffffffff64;
  DivideTest<unsigned_int> *in_stack_ffffffffffffff68;
  
  iVar1 = (int)((ulong)in_ESI * (ulong)*in_RCX >> 0x20);
  uVar2 = (in_ESI - iVar1 >> 1) + iVar1 >> ((byte)in_RCX[1] & 0x1f);
  if (uVar2 != in_ESI / in_EDX) {
    std::operator<<((ostream *)&std::cerr,"Failure for ");
    testcase_name_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::operator<<((ostream *)&std::cerr,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::operator<<((ostream *)&std::cerr,": ");
    std::ostream::operator<<((ostream *)&std::cerr,in_ESI);
    std::operator<<((ostream *)&std::cerr," / ");
    std::ostream::operator<<((ostream *)&std::cerr,in_EDX);
    std::operator<<((ostream *)&std::cerr," = ");
    std::ostream::operator<<((ostream *)&std::cerr,in_ESI / in_EDX);
    std::operator<<((ostream *)&std::cerr,", but got ");
    std::ostream::operator<<((ostream *)&std::cerr,uVar2);
    std::operator<<((ostream *)&std::cerr,"\n");
    exit(1);
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }